

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

__pid_t __thiscall hwnet::util::TimerRoutine::wait(TimerRoutine *this,void *__stat_loc)

{
  mutex *__mutex;
  int iVar1;
  milliseconds mVar2;
  duration<unsigned_long,_std::ratio<1L,_1000L>_> local_40;
  undefined1 local_38 [8];
  Ptr top;
  
  __mutex = &(this->mgr).mtx;
  std::mutex::lock(__mutex);
  if ((this->mgr).elements_size == 0) {
    this->waitting = true;
    this->waitTime = 0xffffffff;
    local_38 = (undefined1  [8])0xffffffff;
    std::_V2::condition_variable_any::wait_for<std::mutex,unsigned_long,std::ratio<1l,1000l>>
              (&this->cv,__mutex,(duration<unsigned_long,_std::ratio<1L,_1000L>_> *)local_38);
  }
  else {
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_38,
               &((*(this->mgr).elements.
                   super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                   _M_impl.super__Vector_impl_data._M_start)->selfPtr).
                super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    mVar2 = (long)*(void **)((long)local_38 + 0x30) - (long)__stat_loc;
    if (__stat_loc <= *(void **)((long)local_38 + 0x30) && mVar2 != 0) {
      this->waitting = true;
      this->waitTime = mVar2;
      local_40.__r = mVar2;
      std::_V2::condition_variable_any::wait_for<std::mutex,unsigned_long,std::ratio<1l,1000l>>
                (&this->cv,__mutex,&local_40);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&top);
  }
  this->waitting = false;
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return iVar1;
}

Assistant:

void TimerRoutine::wait(milliseconds now) {
	std::lock_guard<std::mutex> guard(this->mgr.mtx);
	if(this->mgr.elements_size == 0) {
		this->waitting = true;
		this->waitTime = 0xFFFFFFFF;
		this->cv.wait_for(this->mgr.mtx,this->waitTime * 1ms);
	} else {
		auto top = this->mgr.top();
		if(top->mExpiredTime > now) {
			this->waitting = true;
			this->waitTime = top->mExpiredTime - now;
			this->cv.wait_for(this->mgr.mtx,this->waitTime * 1ms);			
		}
	}
	this->waitting = false;
}